

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void fieldsel(LexState *ls,expdesc *v)

{
  FuncState *fs;
  int iVar1;
  TString *s;
  expdesc key;
  expdesc local_68;
  
  fs = ls->fs;
  local_68.usertype = (TString *)0x0;
  local_68.k = VVOID;
  local_68._4_4_ = 0;
  local_68.u.ival = 0;
  local_68.u.ind.usertype = (TString *)0x0;
  local_68.t = 0;
  local_68.f = 0;
  local_68.ravi_type_map = 0xffffffff;
  local_68._36_4_ = 0;
  local_68.pc = -1;
  local_68._52_4_ = 0;
  luaK_exp2anyregup(fs,v);
  luaX_next(ls);
  s = str_checkname(ls);
  iVar1 = luaK_stringK(ls->fs,s);
  local_68.t = -1;
  local_68.f = -1;
  local_68.k = VK;
  local_68.u.info = iVar1;
  local_68.ravi_type_map = 0x100;
  local_68.usertype = (TString *)0x0;
  local_68.pc = -1;
  local_68.u.ind.usertype = (TString *)0x0;
  luaK_indexed(fs,v,&local_68);
  return;
}

Assistant:

static void fieldsel (LexState *ls, expdesc *v) {
  /* fieldsel -> ['.' | ':'] NAME */
  FuncState *fs = ls->fs;
  expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  luaK_exp2anyregup(fs, v);
  luaX_next(ls);  /* skip the dot or colon */
  checkname(ls, &key);
  luaK_indexed(fs, v, &key);
}